

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O3

void __thiscall slang::parsing::Parser::handleExponentSplit(Parser *this,Token token,size_t offset)

{
  char *pcVar1;
  Lexer *this_00;
  Preprocessor *pPVar2;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  BumpAllocator *alloc;
  Token sourceToken;
  SmallVector<slang::parsing::Token,_4UL> split;
  
  pcVar1 = split.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  split.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  split.super_SmallVectorBase<slang::parsing::Token>.cap = 4;
  this_00 = (Lexer *)(this->super_ParserBase).alloc;
  split.super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)pcVar1;
  alloc = (BumpAllocator *)ParserBase::getDiagnostics(&this->super_ParserBase);
  pPVar2 = (this->super_ParserBase).window.tokenSource;
  sourceToken.info = (Info *)offset;
  sourceToken._0_8_ = token.info;
  Lexer::splitTokens(this_00,alloc,(Diagnostics *)pPVar2->sourceManager,token._0_8_,sourceToken,
                     (ulong)(pPVar2->keywordVersionStack).
                            super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1],(KeywordVersion)&split,
                     (SmallVectorBase<slang::parsing::Token> *)
                     split.super_SmallVectorBase<slang::parsing::Token>.data_);
  tokens._M_extent._M_extent_value = split.super_SmallVectorBase<slang::parsing::Token>.len;
  tokens._M_ptr = split.super_SmallVectorBase<slang::parsing::Token>.data_;
  ParserBase::pushTokens(&this->super_ParserBase,tokens);
  if (split.super_SmallVectorBase<slang::parsing::Token>.data_ != (pointer)pcVar1) {
    operator_delete(split.super_SmallVectorBase<slang::parsing::Token>.data_);
  }
  return;
}

Assistant:

void Parser::handleExponentSplit(Token token, size_t offset) {
    SmallVector<Token, 4> split;
    Lexer::splitTokens(alloc, getDiagnostics(), getPP().getSourceManager(), token, offset,
                       getPP().getCurrentKeywordVersion(), split);

    pushTokens(split);
}